

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlRemove0(NodeAVL *nd,int freeMem)

{
  NodeAVL *pNVar1;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    local_8 = avlRemoveThisNode(nd,freeMem);
  }
  else {
    if (*(long *)(in_RDI + 0x38) == *(long *)(in_RDI + 0x20)) {
      pNVar1 = avlRemove0((NodeAVL *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
      *(NodeAVL **)(in_RDI + 0x20) = pNVar1;
    }
    if (*(long *)(in_RDI + 0x38) == *(long *)(in_RDI + 0x28)) {
      pNVar1 = avlRemove0((NodeAVL *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
      *(NodeAVL **)(in_RDI + 0x28) = pNVar1;
    }
    *(undefined8 *)(in_RDI + 0x38) = 0;
    local_8 = avlBalance((NodeAVL *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  return local_8;
}

Assistant:

static
NodeAVL* avlRemove0( NodeAVL* nd, const int freeMem ){
    if ( nd->tmp ){
        if ( nd->tmp == nd->left ) nd->left = avlRemove0( nd->left, freeMem );
        if ( nd->tmp == nd->right ) nd->right = avlRemove0( nd->right, freeMem );
        nd->tmp = 0;
        return avlBalance( nd ); // FIXME ma tu byt ten return?
    } else return avlRemoveThisNode( nd, freeMem );
}